

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFOutlineObjectHelper.hh
# Opt level: O2

void __thiscall QPDFOutlineObjectHelper::~QPDFOutlineObjectHelper(QPDFOutlineObjectHelper *this)

{
  __shared_ptr<QPDFOutlineObjectHelper,_(__gnu_cxx::_Lock_policy)2> local_18;
  
  (this->super_QPDFObjectHelper)._vptr_QPDFObjectHelper =
       (_func_int **)&PTR__QPDFOutlineObjectHelper_002afd40;
  local_18._M_ptr = (element_type *)0x0;
  local_18._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__shared_ptr<QPDFOutlineObjectHelper,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(((this->m).
                super___shared_ptr<QPDFOutlineObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr)->parent).
              super___shared_ptr<QPDFOutlineObjectHelper,_(__gnu_cxx::_Lock_policy)2>,&local_18);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_18._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->m).
              super___shared_ptr<QPDFOutlineObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  QPDFObjectHelper::~QPDFObjectHelper(&this->super_QPDFObjectHelper);
  return;
}

Assistant:

~QPDFOutlineObjectHelper() override
    {
        // This must be cleared explicitly to avoid circular references that prevent cleanup of
        // shared pointers.
        m->parent = nullptr;
    }